

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdarith.c
# Opt level: O3

void process_restart(j_decompress_ptr cinfo)

{
  jpeg_entropy_decoder *pjVar1;
  jpeg_error_mgr *pjVar2;
  jpeg_component_info *pjVar3;
  _func_boolean_j_decompress_ptr_JBLOCKROW_ptr *p_Var4;
  boolean bVar5;
  long lVar6;
  
  pjVar1 = cinfo->entropy;
  bVar5 = (*cinfo->marker->read_restart_marker)(cinfo);
  if (bVar5 == 0) {
    pjVar2 = cinfo->err;
    pjVar2->msg_code = 0x18;
    (*pjVar2->error_exit)((j_common_ptr)cinfo);
  }
  if (0 < cinfo->comps_in_scan) {
    lVar6 = 0;
    do {
      pjVar3 = cinfo->cur_comp_info[lVar6];
      if (cinfo->progressive_mode == 0) {
LAB_001168ca:
        p_Var4 = (&pjVar1[3].decode_mcu)[pjVar3->dc_tbl_no];
        *(undefined8 *)(p_Var4 + 0x30) = 0;
        *(undefined8 *)(p_Var4 + 0x38) = 0;
        *(undefined8 *)(p_Var4 + 0x20) = 0;
        *(undefined8 *)(p_Var4 + 0x28) = 0;
        *(undefined8 *)(p_Var4 + 0x10) = 0;
        *(undefined8 *)(p_Var4 + 0x18) = 0;
        *(undefined8 *)p_Var4 = 0;
        *(undefined8 *)(p_Var4 + 8) = 0;
        *(undefined4 *)(&pjVar1[1].field_0x14 + lVar6 * 4) = 0;
        *(undefined4 *)((long)&pjVar1[2].decode_mcu + lVar6 * 4 + 4) = 0;
        if ((cinfo->progressive_mode == 0) || (cinfo->Ss != 0)) {
LAB_00116901:
          memset(*(void **)(&pjVar1[8].insufficient_data + (long)pjVar3->ac_tbl_no * 2),0,0x100);
        }
      }
      else {
        if (cinfo->Ss != 0) goto LAB_00116901;
        if (cinfo->Ah == 0) goto LAB_001168ca;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < cinfo->comps_in_scan);
  }
  pjVar1[1].start_pass = (_func_void_j_decompress_ptr *)0x0;
  pjVar1[1].decode_mcu = (_func_boolean_j_decompress_ptr_JBLOCKROW_ptr *)0x0;
  pjVar1[1].insufficient_data = -0x10;
  *(uint *)((long)&pjVar1[3].start_pass + 4) = cinfo->restart_interval;
  return;
}

Assistant:

LOCAL(void)
process_restart(j_decompress_ptr cinfo)
{
  arith_entropy_ptr entropy = (arith_entropy_ptr)cinfo->entropy;
  int ci;
  jpeg_component_info *compptr;

  /* Advance past the RSTn marker */
  if (!(*cinfo->marker->read_restart_marker) (cinfo))
    ERREXIT(cinfo, JERR_CANT_SUSPEND);

  /* Re-initialize statistics areas */
  for (ci = 0; ci < cinfo->comps_in_scan; ci++) {
    compptr = cinfo->cur_comp_info[ci];
    if (!cinfo->progressive_mode || (cinfo->Ss == 0 && cinfo->Ah == 0)) {
      MEMZERO(entropy->dc_stats[compptr->dc_tbl_no], DC_STAT_BINS);
      /* Reset DC predictions to 0 */
      entropy->last_dc_val[ci] = 0;
      entropy->dc_context[ci] = 0;
    }
    if (!cinfo->progressive_mode || cinfo->Ss) {
      MEMZERO(entropy->ac_stats[compptr->ac_tbl_no], AC_STAT_BINS);
    }
  }

  /* Reset arithmetic decoding variables */
  entropy->c = 0;
  entropy->a = 0;
  entropy->ct = -16;    /* force reading 2 initial bytes to fill C */

  /* Reset restart counter */
  entropy->restarts_to_go = cinfo->restart_interval;
}